

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::detail::read_content_chunked(detail *this,Stream *strm,string *out)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  __ssize_t _Var4;
  string *psVar5;
  string *psVar6;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *__n_00;
  size_t *__n_01;
  size_t *extraout_RDX_00;
  string *psVar7;
  char **__lineptr;
  allocator local_f1;
  string chunk;
  stream_line_reader reader;
  undefined1 local_88 [32];
  string local_68;
  char buf [16];
  
  __stream = (FILE *)&reader.glowable_buffer_;
  reader.fixed_buffer_ = buf;
  reader.fixed_buffer_size_ = 0x10;
  reader.glowable_buffer_._M_dataplus._M_p = (pointer)&reader.glowable_buffer_.field_2;
  reader.glowable_buffer_._M_string_length = 0;
  reader.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  reader.strm_ = (Stream *)this;
  _Var4 = stream_line_reader::getline(&reader,(char **)strm,(size_t *)out,__stream);
  if ((char)_Var4 != '\0') {
    psVar7 = (string *)&reader.fixed_buffer_;
    psVar5 = &reader.glowable_buffer_;
    if (reader.glowable_buffer_._M_string_length == 0) {
      psVar5 = psVar7;
    }
    std::__cxx11::string::string
              ((string *)&chunk,(psVar5->_M_dataplus)._M_p,(allocator *)(local_88 + 0x20));
    __lineptr = (char **)0x0;
    uVar3 = std::__cxx11::stoi(&chunk,(size_t *)0x0,0x10);
    std::__cxx11::string::~string((string *)&chunk);
    psVar5 = (string *)(local_88 + 0x20);
    __n = extraout_RDX;
    while (0 < (int)uVar3) {
      chunk._M_dataplus._M_p = (pointer)&chunk.field_2;
      chunk._M_string_length = 0;
      chunk.field_2._M_local_buf[0] = '\0';
      local_88._0_8_ = 0;
      local_88._8_8_ = (char *)0x0;
      local_88._16_8_ = (char *)0x0;
      local_88._24_8_ = (char *)0x0;
      __stream = (FILE *)local_88;
      psVar6 = &chunk;
      bVar2 = read_content_with_length((Stream *)this,&chunk,(ulong)uVar3,(Progress *)local_88);
      std::_Function_base::~_Function_base((_Function_base *)local_88);
      if ((!bVar2) ||
         (_Var4 = stream_line_reader::getline(&reader,(char **)psVar6,__n_00,__stream),
         (char)_Var4 == '\0')) {
LAB_0015e1f6:
        std::__cxx11::string::~string((string *)&chunk);
        goto LAB_0015e200;
      }
      psVar6 = &reader.glowable_buffer_;
      if (reader.glowable_buffer_._M_string_length == 0) {
        psVar6 = psVar7;
      }
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      if (((*pcVar1 != '\r') || (pcVar1[1] != '\n')) || (pcVar1[2] != '\0')) {
        std::__cxx11::string::~string((string *)&chunk);
        goto LAB_0015e20e;
      }
      psVar6 = &chunk;
      std::__cxx11::string::append((string *)strm);
      _Var4 = stream_line_reader::getline(&reader,(char **)psVar6,__n_01,__stream);
      if ((char)_Var4 == '\0') goto LAB_0015e1f6;
      psVar6 = &reader.glowable_buffer_;
      if (reader.glowable_buffer_._M_string_length == 0) {
        psVar6 = psVar7;
      }
      std::__cxx11::string::string((string *)psVar5,(psVar6->_M_dataplus)._M_p,&local_f1);
      __lineptr = (char **)0x0;
      uVar3 = std::__cxx11::stoi(psVar5,(size_t *)0x0,0x10);
      std::__cxx11::string::~string((string *)psVar5);
      std::__cxx11::string::~string((string *)&chunk);
      __n = extraout_RDX_00;
    }
    if (uVar3 != 0) {
LAB_0015e20e:
      bVar2 = true;
      goto LAB_0015e210;
    }
    _Var4 = stream_line_reader::getline(&reader,__lineptr,__n,__stream);
    if ((char)_Var4 != '\0') {
      if (reader.glowable_buffer_._M_string_length != 0) {
        psVar7 = &reader.glowable_buffer_;
      }
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      if (((*pcVar1 == '\r') && (pcVar1[1] == '\n')) && (pcVar1[2] == '\0')) goto LAB_0015e20e;
    }
  }
LAB_0015e200:
  bVar2 = false;
LAB_0015e210:
  std::__cxx11::string::~string((string *)&reader.glowable_buffer_);
  return bVar2;
}

Assistant:

inline bool read_content_chunked(Stream& strm, std::string& out)
{
    const auto bufsiz = 16;
    char buf[bufsiz];

    stream_line_reader reader(strm, buf, bufsiz);

    if (!reader.getline()) {
        return false;
    }

    auto chunk_len = std::stoi(reader.ptr(), 0, 16);

    while (chunk_len > 0){
        std::string chunk;
        if (!read_content_with_length(strm, chunk, chunk_len, nullptr)) {
            return false;
        }

        if (!reader.getline()) {
            return false;
        }

        if (strcmp(reader.ptr(), "\r\n")) {
            break;
        }

        out += chunk;

        if (!reader.getline()) {
            return false;
        }

        chunk_len = std::stoi(reader.ptr(), 0, 16);
    }

    if (chunk_len == 0) {
        // Reader terminator after chunks
        if (!reader.getline() || strcmp(reader.ptr(), "\r\n"))
            return false;
    }

    return true;
}